

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O0

TValue * lj_clib_index(lua_State *L,CLibrary *cl,GCstr *name)

{
  CTypeID CVar1;
  char *pcVar2;
  void *pvVar3;
  void *pvVar4;
  GCstr *in_RDX;
  lua_State *in_RDI;
  GCcdata *cd;
  void *p;
  char *sym;
  CType *ctt;
  CTypeID id;
  CType *ct;
  CTState *cts;
  TValue *tv;
  GCcdata *cd_1;
  CTState *cts_1;
  char *in_stack_fffffffffffffef8;
  CLibrary *in_stack_ffffffffffffff00;
  GCstr *in_stack_ffffffffffffff08;
  lua_State *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  CType *local_e0;
  CTState *local_d8;
  TValue *local_d0;
  GCstr *local_c8;
  lua_State *local_b8;
  undefined2 uVar5;
  MSize size;
  
  local_c8 = in_RDX;
  local_b8 = in_RDI;
  local_d0 = lj_tab_setstr((lua_State *)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                           (GCtab *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if ((local_d0->field_2).it == 0xffffffff) {
    local_d8 = (CTState *)(ulong)*(uint *)((ulong)(local_b8->glref).ptr32 + 0xfc);
    local_d8->L = local_b8;
    CVar1 = lj_ctype_getname(local_d8,&local_e0,local_c8,0x1840);
    if (CVar1 == 0) {
      lj_err_callerv(local_b8,LJ_ERR_FFI_NODECL,local_c8 + 1);
    }
    if (local_e0->info >> 0x1c == 0xb) {
      if (((local_d8->tab[local_e0->info & 0xffff].info & 0x800000) == 0) ||
         (-1 < (int)local_e0->size)) {
        local_d0->n = (double)(int)local_e0->size;
      }
      else {
        local_d0->n = (double)local_e0->size;
      }
    }
    else {
      pcVar2 = clib_extsym(local_d8,local_e0,local_c8);
      uVar5 = (undefined2)CVar1;
      size = (MSize)((ulong)pcVar2 >> 0x20);
      pvVar3 = clib_getsym(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      if (pvVar3 == (void *)0x0) {
        clib_error_((lua_State *)0x0);
      }
      pvVar4 = lj_mem_newgco(in_stack_ffffffffffffff10,size);
      *(undefined1 *)((long)pvVar4 + 5) = 10;
      *(undefined2 *)((long)pvVar4 + 6) = uVar5;
      *(void **)((long)pvVar4 + 8) = pvVar3;
      (local_d0->u32).lo = (uint32_t)pvVar4;
      (local_d0->field_2).it = 0xfffffff5;
    }
  }
  return local_d0;
}

Assistant:

TValue *lj_clib_index(lua_State *L, CLibrary *cl, GCstr *name)
{
  TValue *tv = lj_tab_setstr(L, cl->cache, name);
  if (LJ_UNLIKELY(tvisnil(tv))) {
    CTState *cts = ctype_cts(L);
    CType *ct;
    CTypeID id = lj_ctype_getname(cts, &ct, name, CLNS_INDEX);
    if (!id)
      lj_err_callerv(L, LJ_ERR_FFI_NODECL, strdata(name));
    if (ctype_isconstval(ct->info)) {
      CType *ctt = ctype_child(cts, ct);
      lua_assert(ctype_isinteger(ctt->info) && ctt->size <= 4);
      if ((ctt->info & CTF_UNSIGNED) && (int32_t)ct->size < 0)
	setnumV(tv, (lua_Number)(uint32_t)ct->size);
      else
	setintV(tv, (int32_t)ct->size);
    } else {
      const char *sym = clib_extsym(cts, ct, name);
#if LJ_TARGET_WINDOWS
      DWORD oldwerr = GetLastError();
#endif
      void *p = clib_getsym(cl, sym);
      GCcdata *cd;
      lua_assert(ctype_isfunc(ct->info) || ctype_isextern(ct->info));
#if LJ_TARGET_X86 && LJ_ABI_WIN
      /* Retry with decorated name for fastcall/stdcall functions. */
      if (!p && ctype_isfunc(ct->info)) {
	CTInfo cconv = ctype_cconv(ct->info);
	if (cconv == CTCC_FASTCALL || cconv == CTCC_STDCALL) {
	  CTSize sz = clib_func_argsize(cts, ct);
	  const char *symd = lj_str_pushf(L,
			       cconv == CTCC_FASTCALL ? "@%s@%d" : "_%s@%d",
			       sym, sz);
	  L->top--;
	  p = clib_getsym(cl, symd);
	}
      }
#endif
      if (!p)
	clib_error(L, "cannot resolve symbol " LUA_QS ": %s", sym);
#if LJ_TARGET_WINDOWS
      SetLastError(oldwerr);
#endif
      cd = lj_cdata_new(cts, id, CTSIZE_PTR);
      *(void **)cdataptr(cd) = p;
      setcdataV(L, tv, cd);
    }
  }
  return tv;
}